

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  bool bVar4;
  LinkClosure *pLVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  char *val;
  cmLinkLineComputer *linkLineComputer;
  undefined7 in_register_00000031;
  cmOutputConverter *outputConverter;
  string linkLanguage;
  string cuda_lang;
  string linkRuleVar;
  string extraFlags;
  string local_d0;
  undefined1 local_b0 [40];
  string local_88;
  string local_68;
  cmStateSnapshot local_48;
  
  if ((int)CONCAT71(in_register_00000031,relink) == 0) {
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CUDA","");
    pLVar5 = cmGeneratorTarget::GetLinkClosure
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget,
                        &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         ConfigName);
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((pLVar5->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pLVar5->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_b0);
    pbVar2 = (pLVar5->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
    val = cmGeneratorTarget::GetProperty(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (val == (char *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = cmSystemTools::IsOn(val);
    }
    if (bVar4 == true && _Var6._M_current != pbVar2) {
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"CMAKE_CUDA_DEVICE_LINK_LIBRARY","");
      WriteDeviceLibraryRules(this,&local_d0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetLinkerLanguage
            (&local_d0,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d0._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_88);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&local_68,&local_d0);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMAKE_MODULE_LINKER_FLAGS","")
  ;
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar3,&local_68,(string *)local_b0,config);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar3 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_48,(cmLocalGenerator *)pcVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b0,&local_48);
  linkLineComputer =
       cmMakefileTargetGenerator::CreateLinkLineComputer
                 (&this->super_cmMakefileTargetGenerator,outputConverter,
                  (cmStateDirectory *)local_b0);
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,linkLineComputer,&local_68);
  WriteLibraryRules(this,&local_88,&local_68,relink);
  if (linkLineComputer != (cmLinkLineComputer *)0x0) {
    (*linkLineComputer->_vptr_cmLinkLineComputer[1])(linkLineComputer);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{

  if (!relink) {
    const std::string cuda_lang("CUDA");
    cmGeneratorTarget::LinkClosure const* closure =
      this->GeneratorTarget->GetLinkClosure(this->ConfigName);

    const bool hasCUDA =
      (std::find(closure->Languages.begin(), closure->Languages.end(),
                 cuda_lang) != closure->Languages.end());
    bool doDeviceLinking = true;
    if (const char* resolveDeviceSymbols =
          this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
      doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
    }
    if (hasCUDA && doDeviceLinking) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      this->WriteDeviceLibraryRules(linkRuleVar, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_MODULE";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->ConfigName);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}